

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

int __thiscall Bstrlib::CBString::caselessfind(CBString *this,char *b,int pos)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  CBStringException *this_00;
  allocator local_71;
  string local_70;
  CBStringException bstr__cppwrapper_exception;
  tagbstring t;
  
  if (b == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_70,"CBString::CBString::caselessfind NULL.",&local_71);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  uVar1 = (this->super_tagbstring).slen;
  iVar2 = -1;
  if ((((uint)pos <= uVar1) && (iVar2 = pos, *b != '\0')) && (iVar2 = -1, uVar1 != pos)) {
    t.data = (uchar *)b;
    sVar3 = strlen(b);
    t.slen = (int)sVar3;
    t.mlen = -1;
    iVar2 = binstrcaseless(&this->super_tagbstring,pos,&t);
  }
  return iVar2;
}

Assistant:

int CBString::caselessfind (const char * b, int pos) const {
struct tagbstring t;

	if (NULL == b) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
		bstringThrow ("CBString::caselessfind NULL.");
#else
		return BSTR_ERR;
#endif
	}

	if ((unsigned int) pos > (unsigned int) slen) return BSTR_ERR;
	if ('\0' == b[0]) return pos;
	if (pos == slen) return BSTR_ERR;

	btfromcstr (t, b);
	return binstrcaseless ((bstring) this, pos, (bstring) &t);
}